

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::UpsampleLayerParams::ByteSizeLong(UpsampleLayerParams *this)

{
  long lVar1;
  size_t sVar2;
  size_t sVar3;
  ulong uVar4;
  long lVar5;
  int value;
  int value_00;
  
  sVar2 = google::protobuf::internal::WireFormatLite::UInt64Size(&this->scalingfactor_);
  value_00 = 0;
  if (sVar2 == 0) {
    value = 0;
    lVar5 = 0;
  }
  else {
    value = (int)sVar2;
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value);
    lVar5 = sVar3 + 1;
  }
  this->_scalingfactor_cached_byte_size_ = value;
  lVar5 = lVar5 + sVar2;
  uVar4 = (ulong)(uint)(this->fractionalscalingfactor_).current_size_;
  lVar1 = uVar4 * 4;
  if (uVar4 != 0) {
    value_00 = (int)lVar1;
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(value_00);
    lVar5 = lVar5 + sVar2 + 1;
  }
  this->_fractionalscalingfactor_cached_byte_size_ = value_00;
  sVar2 = lVar5 + lVar1;
  if (this->mode_ != 0) {
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended(this->mode_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  if (this->linearupsamplemode_ != 0) {
    sVar3 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->linearupsamplemode_);
    sVar2 = sVar2 + sVar3 + 1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t UpsampleLayerParams::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.UpsampleLayerParams)
  size_t total_size = 0;

  // repeated uint64 scalingFactor = 1;
  {
    size_t data_size = ::google::protobuf::internal::WireFormatLite::
      UInt64Size(this->scalingfactor_);
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _scalingfactor_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // repeated float fractionalScalingFactor = 7;
  {
    unsigned int count = this->fractionalscalingfactor_size();
    size_t data_size = 4UL * count;
    if (data_size > 0) {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::Int32Size(data_size);
    }
    int cached_size = ::google::protobuf::internal::ToCachedSize(data_size);
    GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
    _fractionalscalingfactor_cached_byte_size_ = cached_size;
    GOOGLE_SAFE_CONCURRENT_WRITES_END();
    total_size += data_size;
  }

  // .CoreML.Specification.UpsampleLayerParams.InterpolationMode mode = 5;
  if (this->mode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->mode());
  }

  // .CoreML.Specification.UpsampleLayerParams.LinearUpsampleMode linearUpsampleMode = 6;
  if (this->linearupsamplemode() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->linearupsamplemode());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}